

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O1

void nhr_response_append(nhr_response r,void *received,size_t received_len)

{
  if ((r->transfer_encoding & 1) == 0) {
    nhr_response_add_body_data(r,received,received_len);
  }
  else {
    nhr_response_read_chunks(r,(char *)received);
  }
  nhr_response_check_is_finished(r);
  return;
}

Assistant:

void nhr_response_append(nhr_response r, void * received, const size_t received_len) {
	if (r->transfer_encoding & NHR_TRANSFER_ENCODING_CHUNKED) {
#if !defined(NHR_NO_RECV_CHUNKS)
		nhr_response_read_chunks(r, (char *)received);
#endif
	} else {
		nhr_response_add_body_data(r, received, received_len);
	}
	nhr_response_check_is_finished(r);
}